

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,bool bOrderMinToMax)

{
  bool bVar1;
  byte in_DL;
  undefined7 in_register_00000031;
  ON_SubDEdgeSharpness *this_00;
  double dVar2;
  double dVar3;
  bool local_79;
  ON_SubDEdgeSharpness local_60 [3];
  ON_wString local_48;
  ON_SubDEdgeSharpness local_40;
  ON_wString local_38;
  double local_30;
  double s1;
  double s0;
  int i0;
  bool bOrderMinToMax_local;
  ON_SubDEdgeSharpness *this_local;
  
  this_00 = (ON_SubDEdgeSharpness *)CONCAT71(in_register_00000031,bOrderMinToMax);
  s0._7_1_ = in_DL & 1;
  _i0 = this_00;
  this_local = this;
  bVar1 = IsValid(this_00);
  if (bVar1) {
    bVar1 = IsConstant(this_00);
    if (bVar1) {
      dVar2 = EndSharpness(this_00,0);
      ToPercentageText(this,dVar2);
    }
    else {
      local_79 = false;
      if ((s0._7_1_ & 1) != 0) {
        dVar2 = EndSharpness(this_00,0);
        dVar3 = EndSharpness(this_00,1);
        local_79 = dVar3 < dVar2;
      }
      s0._0_4_ = (uint)local_79;
      s1 = EndSharpness(this_00,s0._0_4_);
      local_30 = EndSharpness(this_00,1 - s0._0_4_);
      ToPercentageText(&local_40,s1);
      ON_wString::ON_wString(&local_48,"-");
      ON_wString::operator+(&local_38,(ON_wString *)&local_40);
      ToPercentageText(local_60,local_30);
      ON_wString::operator+((ON_wString *)this,&local_38);
      ON_wString::~ON_wString((ON_wString *)local_60);
      ON_wString::~ON_wString(&local_38);
      ON_wString::~ON_wString(&local_48);
      ON_wString::~ON_wString((ON_wString *)&local_40);
    }
  }
  else {
    bVar1 = IsCrease(this_00);
    if (bVar1) {
      ToPercentageText(this,5.0);
    }
    else {
      ToPercentageText(this,ON_DBL_QNAN);
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(bool bOrderMinToMax) const
{
  if (IsValid())
  {
    if ( IsConstant() )
      return ON_SubDEdgeSharpness::ToPercentageText(EndSharpness(0));
    const int i0 = (bOrderMinToMax && (EndSharpness(0) > EndSharpness(1))) ? 1 : 0;
    const double s0 = EndSharpness(i0);
    const double s1 = EndSharpness(1-i0);
    return
      ON_SubDEdgeSharpness::ToPercentageText(s0)
      + ON_wString("-")
      + ON_SubDEdgeSharpness::ToPercentageText(s1);
  }

  if (IsCrease())
    return ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness::CreaseValue);

  // invalid sharpness
  return ON_SubDEdgeSharpness::ToPercentageText(ON_DBL_QNAN);
}